

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O0

char * copyTypeEncoding(char *types)

{
  size_t __n;
  char *__dest;
  char *copy;
  size_t length;
  char *types_local;
  
  __n = lengthOfTypeEncoding(types);
  __dest = (char *)malloc(__n + 1);
  memcpy(__dest,types,__n);
  __dest[__n] = '\0';
  return __dest;
}

Assistant:

static char* copyTypeEncoding(const char *types)
{
	size_t length = lengthOfTypeEncoding(types);
	char *copy = malloc(length + 1);
	memcpy(copy, types, length);
	copy[length] = '\0';
	return copy;
}